

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestSimpleChdir::Run(ParserTestSimpleChdir *this)

{
  VirtualFileSystem *this_00;
  int iVar1;
  Edge *this_01;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  VirtualFileSystem *fs;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"test-a",(allocator<char> *)&local_50);
  this_00 = &(this->super_ParserTest).fs_;
  VirtualFileSystem::MakeDir(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"test-a/a.ninja",&local_71)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "rule cat\n  command = cat $in > $out\nbuild out2: cat in1\nbuild out1: cat in2\nbuild final: cat out1\n"
             ,&local_72);
  VirtualFileSystem::Create(this_00,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "subninja a.ninja\n    chdir = test-a\n\nrule pipe-through-test-a\n    command = $in | test-a/final > $out\n\nbuild foo: pipe-through-test-a | test-a/final\n\n"
            );
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    ParserTest::VerifyCwd_abi_cxx11_(&local_70,(ParserTest *)this_00,fs);
    bVar3 = std::operator==("/",&local_70);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
               ,0x4b0,"\"/\" == VerifyCwd(fs_)");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"test-a/final",(allocator<char> *)&local_50);
    pNVar4 = ParserTest::GetNode(&this->super_ParserTest,&local_70);
    this_01 = pNVar4->in_edge_;
    std::__cxx11::string::~string((string *)&local_70);
    pTVar2 = g_current_test;
    Edge::EvaluateCommand_abi_cxx11_(&local_70,this_01,false);
    bVar3 = std::operator==("cd \"test-a/\" && cat out1 > final",&local_70);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
               ,0x4b7,"\"cd \\\"test-a/\\\" && cat out1 > final\" == edge->EvaluateCommand()");
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, SimpleChdir) {
  fs_.MakeDir("test-a");
  fs_.Create("test-a/a.ninja",
    "rule cat\n"
    "  command = cat $in > $out\n"
    "build out2: cat in1\n"
    "build out1: cat in2\n"
    "build final: cat out1\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"subninja a.ninja\n"
"    chdir = test-a\n"
"\n"
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
  ));
  EXPECT_EQ("/", VerifyCwd(fs_));  // Verify cwd was restored

  // Verify edge command includes correct 'cd test-a'
  Edge* edge = GetNode("test-a/final")->in_edge();
#if _WIN32
  EXPECT_EQ("cmd /c cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#else
  EXPECT_EQ("cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#endif
}